

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::GeometryHelper_CoordIdxStr2FacesArr
          (X3DImporter *this,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<aiFace,_std::allocator<aiFace>_> *pFaces,uint *pPrimitiveTypes)

{
  undefined1 auVar1 [16];
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  reference piVar5;
  ulong uVar6;
  void *__dest;
  uint *__src;
  reference pvVar7;
  size_t i_e;
  size_t i;
  size_type local_98;
  size_t ts;
  aiFace tface;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  iterator it;
  value_type_conflict4 local_60;
  uint local_5c;
  undefined1 local_58 [4];
  uint prim_type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inds;
  vector<int,_std::allocator<int>_> f_data;
  uint *pPrimitiveTypes_local;
  vector<aiFace,_std::allocator<aiFace>_> *pFaces_local;
  vector<int,_std::allocator<int>_> *pCoordIdx_local;
  X3DImporter *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &inds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCoordIdx);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_5c = 0;
  pvVar3 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)
                      &inds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  if (*pvVar3 != -1) {
    local_60 = -1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &inds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_60);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &inds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<aiFace,_std::allocator<aiFace>_>::reserve(pFaces,sVar4 / 3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,4);
  local_78._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         &inds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  do {
    tface.mIndices =
         (uint *)std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)
                            &inds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &tface.mIndices);
    if (!bVar2) {
      *pPrimitiveTypes = local_5c;
      i._4_4_ = 1;
LAB_008d71d6:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &inds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_78);
    if (*piVar5 == -1) {
      aiFace::aiFace((aiFace *)&ts);
      local_98 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      switch(local_98) {
      case 0:
        i._4_4_ = 6;
        goto LAB_008d70ab;
      case 1:
        local_5c = local_5c | 1;
        break;
      case 2:
        local_5c = local_5c | 2;
        break;
      case 3:
        local_5c = local_5c | 4;
        break;
      default:
        local_5c = local_5c | 8;
      }
      ts._0_4_ = (undefined4)local_98;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_98;
      uVar6 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      __dest = operator_new__(uVar6);
      tface._0_8_ = __dest;
      __src = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      memcpy(__dest,__src,local_98 << 2);
      std::vector<aiFace,_std::allocator<aiFace>_>::push_back(pFaces,(value_type *)&ts);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      i._4_4_ = 0;
LAB_008d70ab:
      aiFace::~aiFace((aiFace *)&ts);
      if (i._4_4_ != 0) {
        if (i._4_4_ == 6) {
          i_e = 0;
          sVar4 = std::vector<aiFace,_std::allocator<aiFace>_>::size(pFaces);
          for (; i_e < sVar4; i_e = i_e + 1) {
            pvVar7 = std::vector<aiFace,_std::allocator<aiFace>_>::at(pFaces,i_e);
            if (pvVar7->mIndices != (uint *)0x0) {
              operator_delete__(pvVar7->mIndices);
            }
          }
          std::vector<aiFace,_std::allocator<aiFace>_>::clear(pFaces);
          i._4_4_ = 0;
        }
        goto LAB_008d71d6;
      }
    }
    else {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_78);
      i._0_4_ = *piVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                 (value_type_conflict2 *)&i);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_78);
  } while( true );
}

Assistant:

void X3DImporter::GeometryHelper_CoordIdxStr2FacesArr(const std::vector<int32_t>& pCoordIdx, std::vector<aiFace>& pFaces, unsigned int& pPrimitiveTypes) const
{
    std::vector<int32_t> f_data(pCoordIdx);
    std::vector<unsigned int> inds;
    unsigned int prim_type = 0;

    if ( f_data.back() != ( -1 ) )
    {
        f_data.push_back( -1 );
    }

	// reserve average size.
	pFaces.reserve(f_data.size() / 3);
	inds.reserve(4);
    //PrintVectorSet("build. ci", pCoordIdx);
	for(std::vector<int32_t>::iterator it = f_data.begin(); it != f_data.end(); ++it)
	{
		// when face is got count how many indices in it.
		if(*it == (-1))
		{
			aiFace tface;
			size_t ts;

			ts = inds.size();
			switch(ts)
			{
				case 0: goto mg_m_err;
				case 1: prim_type |= aiPrimitiveType_POINT; break;
				case 2: prim_type |= aiPrimitiveType_LINE; break;
				case 3: prim_type |= aiPrimitiveType_TRIANGLE; break;
				default: prim_type |= aiPrimitiveType_POLYGON; break;
			}

			tface.mNumIndices = static_cast<unsigned int>(ts);
			tface.mIndices = new unsigned int[ts];
			memcpy(tface.mIndices, inds.data(), ts * sizeof(unsigned int));
			pFaces.push_back(tface);
			inds.clear();
		}// if(*it == (-1))
		else
		{
			inds.push_back(*it);
		}// if(*it == (-1)) else
	}// for(std::list<int32_t>::iterator it = f_data.begin(); it != f_data.end(); it++)
//PrintVectorSet("build. faces", pCoordIdx);

	pPrimitiveTypes = prim_type;

	return;

mg_m_err:

	for(size_t i = 0, i_e = pFaces.size(); i < i_e; i++) delete [] pFaces.at(i).mIndices;

	pFaces.clear();
}